

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_idx_abc(jit_State *J,TRef asizeref,TRef ikey,uint32_t asize)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  IRRef1 IVar3;
  IRIns *pIVar5;
  ulong uVar6;
  IRRef1 IVar7;
  int iVar8;
  uint uVar9;
  IROpT IVar10;
  TRef TVar4;
  
  IVar2 = (IRRef1)asizeref;
  if ((~J->flags & 0xc00000) == 0) {
    uVar9 = ikey & 0xffff;
    pIVar1 = (J->cur).ir;
    pIVar5 = pIVar1 + uVar9;
    if ((pIVar5->field_1).o == ')') {
      IVar7 = (pIVar5->field_0).op2;
      if ((long)(short)IVar7 < 0) goto LAB_0013f9e3;
      iVar8 = pIVar1[(short)IVar7].i;
      uVar9 = (uint)(pIVar5->field_0).op1;
      pIVar5 = pIVar1 + (pIVar5->field_0).op1;
    }
    else {
LAB_0013f9e3:
      iVar8 = 0;
      IVar7 = 0;
    }
    if ((uVar9 == (J->scev).idx) &&
       ((ulong)((long)(int)J->L->base[((ulong)(pIVar5->field_0).op1 + 1) - (ulong)J->baseslot].n +
               (long)iVar8) < (ulong)asize)) {
      IVar10 = 0xa85;
      if (-1 < (short)IVar2) {
        IVar10 = 0xa94;
      }
      IVar3 = (J->scev).stop;
      if (iVar8 != 0) {
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = IVar3;
        (J->fold).ins.field_0.op2 = IVar7;
        TVar4 = lj_opt_fold(J);
        IVar3 = (IRRef1)TVar4;
      }
      (J->fold).ins.field_0.ot = IVar10;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = IVar3;
      lj_opt_fold(J);
      if ((((J->scev).dir != '\0') && (uVar6 = (ulong)(J->scev).start, uVar6 != 0)) &&
         (-1 < (long)(J->cur).ir[uVar6].i + (long)iVar8)) {
        return;
      }
      (J->fold).ins.field_0.ot = IVar10;
      goto LAB_0013fabf;
    }
  }
  (J->fold).ins.field_0.ot = 0xa93;
LAB_0013fabf:
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)ikey;
  lj_opt_fold(J);
  return;
}

Assistant:

static void rec_idx_abc(jit_State *J, TRef asizeref, TRef ikey, uint32_t asize)
{
  /* Try to emit invariant bounds checks. */
  if ((J->flags & (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) ==
      (JIT_F_OPT_LOOP|JIT_F_OPT_ABC)) {
    IRRef ref = tref_ref(ikey);
    IRIns *ir = IR(ref);
    int32_t ofs = 0;
    IRRef ofsref = 0;
    /* Handle constant offsets. */
    if (ir->o == IR_ADD && irref_isk(ir->op2)) {
      ofsref = ir->op2;
      ofs = IR(ofsref)->i;
      ref = ir->op1;
      ir = IR(ref);
    }
    /* Got scalar evolution analysis results for this reference? */
    if (ref == J->scev.idx) {
      int32_t stop;
      lj_assertJ(irt_isint(J->scev.t) && ir->o == IR_SLOAD,
		 "only int SCEV supported");
      stop = numberVint(&(J->L->base - J->baseslot)[ir->op1 + FORL_STOP]);
      /* Runtime value for stop of loop is within bounds? */
      if ((uint64_t)stop + ofs < (uint64_t)asize) {
	/* Emit invariant bounds check for stop. */
	uint32_t abc = IRTG(IR_ABC, tref_isk(asizeref) ? IRT_U32 : IRT_P32);
	emitir(abc, asizeref, ofs == 0 ? J->scev.stop :
	       emitir(IRTI(IR_ADD), J->scev.stop, ofsref));
	/* Emit invariant bounds check for start, if not const or negative. */
	if (!(J->scev.dir && J->scev.start &&
	      (int64_t)IR(J->scev.start)->i + ofs >= 0))
	  emitir(abc, asizeref, ikey);
	return;
      }
    }
  }
  emitir(IRTGI(IR_ABC), asizeref, ikey);  /* Emit regular bounds check. */
}